

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Echo.cpp
# Opt level: O0

void __thiscall
helics::apps::Echo::loadJsonFile
          (Echo *this,string *jsonFile,bool enableFederateInterfaceRegistration)

{
  undefined1 uVar1;
  bool bVar2;
  int iVar3;
  Time TVar4;
  Endpoint *in_RDI;
  lock_guard<std::mutex> lock;
  value_type echoConfig;
  json doc;
  int ii;
  int eptCount;
  string *in_stack_00000198;
  Endpoint *in_stack_fffffffffffffef8;
  MessageFederate *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  function<void_(const_helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)>
  *in_stack_ffffffffffffff10;
  char (*key) [6];
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  allocator<char> *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  function<void_(const_helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)> *callback;
  char *key_00;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_ffffffffffffff50;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_ffffffffffffff58;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_ffffffffffffff60;
  char local_90 [24];
  function<void_(const_helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)> local_78;
  undefined4 in_stack_ffffffffffffffac;
  int iVar5;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  string *in_stack_ffffffffffffffb8;
  App *in_stack_ffffffffffffffc0;
  time_units in_stack_ffffffffffffffd4;
  json *in_stack_ffffffffffffffd8;
  
  uVar1 = (undefined1)((uint)in_stack_ffffffffffffffac >> 0x18);
  key_00 = &stack0xffffffffffffffc7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
             in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  App::loadJsonFileConfiguration
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (string *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),(bool)uVar1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff00);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
  CLI::std::
  __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x40609b);
  iVar3 = helics::MessageFederate::getEndpointCount((MessageFederate *)0x4060a7);
  for (iVar5 = 0; iVar5 < iVar3; iVar5 = iVar5 + 1) {
    CLI::std::
    __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x4060e9);
    helics::MessageFederate::getEndpoint
              (in_stack_ffffffffffffff00,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
    std::deque<helics::Endpoint,std::allocator<helics::Endpoint>>::emplace_back<helics::Endpoint&>
              ((deque<helics::Endpoint,_std::allocator<helics::Endpoint>_> *)
               in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    CLI::std::deque<helics::Endpoint,_std::allocator<helics::Endpoint>_>::back
              ((deque<helics::Endpoint,_std::allocator<helics::Endpoint>_> *)
               in_stack_ffffffffffffff10);
    callback = &local_78;
    std::function<void(helics::Endpoint_const&,TimeRepresentation<count_time<9,long>>)>::
    function<helics::apps::Echo::loadJsonFile(std::__cxx11::string_const&,bool)::__0,void>
              (in_stack_ffffffffffffff10,
               (anon_class_8_1_8991fb9c *)
               CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
    Endpoint::setCallback(in_RDI,callback);
    std::function<void_(const_helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)>::
    ~function((function<void_(const_helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)> *
              )0x406160);
  }
  key = (char (*) [6])local_90;
  fileops::loadJson(in_stack_00000198);
  uVar1 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::contains<const_char_(&)[5],_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                     (char (*) [5])key);
  if ((bool)uVar1) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
    ::operator[]<char_const>(in_stack_ffffffffffffff50,key_00);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    bVar2 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::contains<const_char_(&)[6],_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)CONCAT17(uVar1,in_stack_ffffffffffffff20),key);
    if (bVar2) {
      std::lock_guard<std::mutex>::lock_guard
                ((lock_guard<std::mutex> *)in_stack_ffffffffffffff00,
                 (mutex_type *)in_stack_fffffffffffffef8);
      in_stack_ffffffffffffff00 =
           (MessageFederate *)
           nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>(in_stack_ffffffffffffff50,key_00);
      TVar4 = fileops::loadJsonTime(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)&in_RDI[2].super_Interface)->_M_allocated_capacity = TVar4.internalTimeCode;
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x4062d6);
    }
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)in_stack_ffffffffffffff00);
  }
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)in_stack_ffffffffffffff00);
  return;
}

Assistant:

void Echo::loadJsonFile(const std::string& jsonFile, bool enableFederateInterfaceRegistration)
    {
        loadJsonFileConfiguration("echo", jsonFile, enableFederateInterfaceRegistration);
        auto eptCount = fed->getEndpointCount();
        for (int ii = 0; ii < eptCount; ++ii) {
            endpoints.emplace_back(fed->getEndpoint(ii));
            endpoints.back().setCallback(
                [this](const Endpoint& ept, Time messageTime) { echoMessage(ept, messageTime); });
        }

        auto doc = fileops::loadJson(jsonFile);

        if (doc.contains("echo")) {
            auto echoConfig = doc["echo"];

            if (echoConfig.contains("delay")) {
                std::lock_guard<std::mutex> lock(delayTimeLock);
                delayTime = fileops::loadJsonTime(echoConfig["delay"]);
            }
        }
    }